

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::bitcast_from_builtin_load
          (CompilerGLSL *this,uint32_t source_id,string *expr,SPIRType *expr_type)

{
  BaseType BVar1;
  bool bVar2;
  uint32_t uVar3;
  SPIRVariable *pSVar4;
  BaseType BVar5;
  string local_48;
  
  pSVar4 = Compiler::maybe_get_backing_variable(&this->super_Compiler,source_id);
  if (pSVar4 != (SPIRVariable *)0x0) {
    source_id = (pSVar4->super_IVariant).self.id;
  }
  bVar2 = Compiler::has_decoration(&this->super_Compiler,(ID)source_id,DecorationBuiltIn);
  if (!bVar2) {
    return;
  }
  uVar3 = Compiler::get_decoration(&this->super_Compiler,(ID)source_id,DecorationBuiltIn);
  BVar1 = *(BaseType *)&(expr_type->super_IVariant).field_0xc;
  BVar5 = BVar1;
  if ((int)uVar3 < 0x1148) {
    if (0x2b < uVar3) goto LAB_001e85e5;
    if ((0xc00000406e0U >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
      if ((0x3f000000UL >> ((ulong)uVar3 & 0x3f) & 1) == 0) goto LAB_001e85e5;
LAB_001e85e0:
      BVar5 = UInt;
      goto LAB_001e85e5;
    }
  }
  else if ((int)uVar3 < 0x14c7) {
    if ((2 < uVar3 - 0x1148) && (uVar3 != 0x1396)) goto LAB_001e85e5;
  }
  else {
    if ((uVar3 - 0x14c7 < 2) || (uVar3 == 0x14e7)) goto LAB_001e85e0;
    if (uVar3 != 0x14cf) goto LAB_001e85e5;
  }
  BVar5 = Int;
LAB_001e85e5:
  if (BVar5 != BVar1) {
    bitcast_expression(&local_48,this,expr_type,BVar5,expr);
    ::std::__cxx11::string::operator=((string *)expr,(string *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void CompilerGLSL::bitcast_from_builtin_load(uint32_t source_id, std::string &expr, const SPIRType &expr_type)
{
	auto *var = maybe_get_backing_variable(source_id);
	if (var)
		source_id = var->self;

	// Only interested in standalone builtin variables.
	if (!has_decoration(source_id, DecorationBuiltIn))
		return;

	auto builtin = static_cast<BuiltIn>(get_decoration(source_id, DecorationBuiltIn));
	auto expected_type = expr_type.basetype;

	// TODO: Fill in for more builtins.
	switch (builtin)
	{
	case BuiltInLayer:
	case BuiltInPrimitiveId:
	case BuiltInViewportIndex:
	case BuiltInInstanceId:
	case BuiltInInstanceIndex:
	case BuiltInVertexId:
	case BuiltInVertexIndex:
	case BuiltInSampleId:
	case BuiltInBaseVertex:
	case BuiltInBaseInstance:
	case BuiltInDrawIndex:
	case BuiltInFragStencilRefEXT:
	case BuiltInInstanceCustomIndexNV:
		expected_type = SPIRType::Int;
		break;

	case BuiltInGlobalInvocationId:
	case BuiltInLocalInvocationId:
	case BuiltInWorkgroupId:
	case BuiltInLocalInvocationIndex:
	case BuiltInWorkgroupSize:
	case BuiltInNumWorkgroups:
	case BuiltInIncomingRayFlagsNV:
	case BuiltInLaunchIdNV:
	case BuiltInLaunchSizeNV:
		expected_type = SPIRType::UInt;
		break;

	default:
		break;
	}

	if (expected_type != expr_type.basetype)
		expr = bitcast_expression(expr_type, expected_type, expr);
}